

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b4dde::writeDString
          (anon_unknown_dwarf_b4dde *this,uint8_t *buffer,char *value,size_t fieldLen)

{
  pointer puVar1;
  iterator __first;
  iterator __last;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> content;
  size_t fieldLen_local;
  char *value_local;
  uint8_t *buffer_local;
  
  content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,(char *)buffer,&local_59);
  serializeDString((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                   (anon_unknown_dwarf_b4dde *)local_58,
                   (string *)
                   content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,fieldLen);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  puVar1 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  if (puVar1 == content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    __first = std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    __last = std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current,(uchar *)this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    return;
  }
  __assert_fail("content.size() == fieldLen",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                ,0xb6,
                "void (anonymous namespace)::writeDString(uint8_t *, const char *, const size_t)");
}

Assistant:

void writeDString(uint8_t *buffer, const char *value, const size_t fieldLen)
{
    auto content = serializeDString(value, fieldLen);
    assert(content.size() == fieldLen);
    std::copy(std::begin(content), std::end(content), buffer);
}